

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

bool __thiscall Graph::is_all_visited(Graph *this)

{
  ulong uVar1;
  bool *pbVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = (ulong)this->num_node;
  bVar5 = true;
  if (1 < (long)uVar3) {
    if (this->nodes[1].visited != true) {
      return false;
    }
    pbVar2 = &this->nodes[2].visited;
    uVar1 = 2;
    do {
      uVar4 = uVar1;
      if (uVar3 == uVar4) break;
      bVar5 = *pbVar2;
      pbVar2 = pbVar2 + 0x20;
      uVar1 = uVar4 + 1;
    } while (bVar5 != false);
    bVar5 = uVar3 <= uVar4;
  }
  return bVar5;
}

Assistant:

bool Graph::is_all_visited() const
{
	for(int i = 1; i < num_node; i++){
		if(!nodes[i].visited){
			return false;
		}
	}
	return true;
}